

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

string * lest::to_string<(anonymous_namespace)::Explicit>
                   (string *__return_storage_ptr__,Explicit *value)

{
  uint *puVar1;
  int iVar2;
  ostream *this;
  ostringstream os;
  ulong *local_1d8;
  size_type local_1d0;
  ulong local_1c8;
  undefined8 uStack_1c0;
  ulong *local_1b8;
  size_type local_1b0;
  undefined1 local_1a8;
  undefined7 uStack_1a7;
  undefined8 uStack_1a0;
  long local_198 [3];
  uint auStack_180 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  puVar1 = (uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18));
  *puVar1 = *puVar1 | 1;
  iVar2 = value->x;
  this = std::operator<<((ostream *)local_198,"Explicit:");
  std::ostream::operator<<((ostream *)this,iVar2);
  std::__cxx11::ostringstream::str();
  if (local_1b8 == (ulong *)&local_1a8) {
    uStack_1c0 = uStack_1a0;
    local_1d8 = &local_1c8;
  }
  else {
    local_1d8 = local_1b8;
  }
  local_1c8 = CONCAT71(uStack_1a7,local_1a8);
  local_1d0 = local_1b0;
  local_1b0 = 0;
  local_1a8 = 0;
  local_1b8 = (ulong *)&local_1a8;
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_1d8 == &local_1c8) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_1c8;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_1c0;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1d8;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_1c8;
  }
  __return_storage_ptr__->_M_string_length = local_1d0;
  local_1d0 = 0;
  local_1c8 = local_1c8 & 0xffffffffffffff00;
  local_1d8 = &local_1c8;
  std::__cxx11::string::~string((string *)&local_1d8);
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string( T const & value )
{
    return string_maker<T>::to_string( value );
}